

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_enrich3(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_EDGE ref_edge_00;
  long lVar8;
  char *pcVar9;
  int iVar10;
  REF_INT local_c8;
  REF_INT node;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT new_cell;
  REF_INT part;
  REF_INT local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  REF_INT local_84;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar3 = ref_geom_constrain_all(ref_grid);
  if (uVar3 == 0) {
    uVar3 = ref_edge_create(&ref_edge,ref_grid);
    ref_edge_00 = ref_edge;
    if (uVar3 == 0) {
      uVar3 = ref_edge->n;
      if ((int)uVar3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT negative");
        return 1;
      }
      __ptr = malloc((ulong)uVar3 * 8);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT NULL");
        return 2;
      }
      for (uVar6 = 0; uVar3 * 2 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)__ptr + uVar6 * 4) = 0xffffffff;
      }
      for (local_c8 = 0; local_c8 < ref_edge_00->n; local_c8 = local_c8 + 1) {
        uVar3 = ref_edge_part(ref_edge_00,local_c8,&part);
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          pcVar9 = "edge part";
          uVar7 = 0x1009;
          goto LAB_0014d5c5;
        }
        if (pRVar1->id == part) {
          uVar3 = ref_node_next_global(ref_node,&global);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "next global";
            uVar7 = 0x100c;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_node_add(ref_node,global,&node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "add node";
            uVar7 = 0x100d;
            goto LAB_0014d5c5;
          }
          *(REF_INT *)((long)__ptr + (long)local_c8 * 8) = node;
          uVar3 = ref_node_interpolate_edge
                            (ref_node,ref_edge->e2n[(long)local_c8 * 2],
                             ref_edge->e2n[local_c8 * 2 + 1],0.3333333333333333,node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new node";
            uVar7 = 0x1011;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_geom_add_constrain_midnode
                            (ref_grid,ref_edge->e2n[(long)local_c8 * 2],
                             ref_edge->e2n[local_c8 * 2 + 1],0.3333333333333333,node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new geom";
            uVar7 = 0x1015;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_node_next_global(ref_node,&global);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "next global";
            uVar7 = 0x1017;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_node_add(ref_node,global,&node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "add node";
            uVar7 = 0x1018;
            goto LAB_0014d5c5;
          }
          *(REF_INT *)((long)__ptr + (long)local_c8 * 8 + 4) = node;
          uVar3 = ref_node_interpolate_edge
                            (ref_node,ref_edge->e2n[local_c8 * 2],
                             ref_edge->e2n[(long)local_c8 * 2 + 1],0.6666666666666666,node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new node";
            uVar7 = 0x101c;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_geom_add_constrain_midnode
                            (ref_grid,ref_edge->e2n[(long)local_c8 * 2],
                             ref_edge->e2n[local_c8 * 2 + 1],0.6666666666666666,node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new geom";
            uVar7 = 0x1020;
            goto LAB_0014d5c5;
          }
        }
        ref_edge_00 = ref_edge;
      }
      for (iVar10 = 0; iVar10 < ref_grid->cell[0]->max; iVar10 = iVar10 + 1) {
        RVar4 = ref_cell_nodes(ref_grid->cell[0],iVar10,local_a8);
        if (RVar4 == 0) {
          local_a8[ref_grid->cell[2]->node_per] = local_a8[ref_grid->cell[0]->node_per];
          uVar3 = ref_edge_with(ref_edge,local_a8[0],local_a8[1],&local_c8);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "find edge01";
            uVar7 = 0x1028;
            goto LAB_0014d5c5;
          }
          lVar8 = (long)local_c8;
          lVar5 = lVar8 * 2;
          if (local_a8[0] == ref_edge->e2n[lVar8 * 2]) {
            local_a8[2] = *(REF_INT *)((long)__ptr + lVar8 * 8);
            lVar5 = (long)(int)((uint)lVar5 | 1);
          }
          else {
            local_a8[2] = *(REF_INT *)((long)__ptr + (long)(int)((uint)lVar5 | 1) * 4);
          }
          local_a8[3] = *(undefined4 *)((long)__ptr + lVar5 * 4);
          uVar3 = ref_cell_add(ref_grid->cell[2],local_a8,&new_cell);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "add";
            uVar7 = 0x1031;
            goto LAB_0014d5c5;
          }
        }
      }
      for (iVar10 = 0; iVar10 < ref_grid->cell[3]->max; iVar10 = iVar10 + 1) {
        RVar4 = ref_cell_nodes(ref_grid->cell[3],iVar10,local_a8);
        if (RVar4 == 0) {
          uVar3 = ref_node_next_global(ref_node,&global);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "next global";
            uVar7 = 0x1035;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_node_add(ref_node,global,&node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "add node";
            uVar7 = 0x1036;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_node_interpolate_face(ref_node,local_a8[0],local_a8[1],local_a8[2],node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new node";
            uVar7 = 0x1038;
            goto LAB_0014d5c5;
          }
          uVar3 = ref_geom_add_constrain_inside_midnode(ref_grid,local_a8,node);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "new node";
            uVar7 = 0x103a;
            goto LAB_0014d5c5;
          }
          local_84 = node;
          local_a8[ref_grid->cell[5]->node_per] = local_a8[ref_grid->cell[3]->node_per];
          uVar3 = ref_edge_with(ref_edge,local_a8[0],local_a8[1],&local_c8);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "find edge01";
            uVar7 = 0x1040;
            goto LAB_0014d5c5;
          }
          lVar8 = (long)local_c8;
          lVar5 = lVar8 * 2;
          if (local_a8[0] == ref_edge->e2n[lVar8 * 2]) {
            local_a8[3] = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar5 = (long)(int)((uint)lVar5 | 1);
          }
          else {
            local_a8[3] = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar5 | 1) * 4);
          }
          local_98 = *(undefined4 *)((long)__ptr + lVar5 * 4);
          uVar3 = ref_edge_with(ref_edge,local_a8[1],local_a8[2],&local_c8);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "find edge12";
            uVar7 = 0x1048;
            goto LAB_0014d5c5;
          }
          lVar8 = (long)local_c8;
          lVar5 = lVar8 * 2;
          if (local_a8[1] == ref_edge->e2n[lVar8 * 2]) {
            local_94 = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar5 = (long)(int)((uint)lVar5 | 1);
          }
          else {
            local_94 = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar5 | 1) * 4);
          }
          local_90 = *(undefined4 *)((long)__ptr + lVar5 * 4);
          uVar3 = ref_edge_with(ref_edge,local_a8[2],local_a8[0],&local_c8);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "find edge20";
            uVar7 = 0x1050;
            goto LAB_0014d5c5;
          }
          lVar8 = (long)local_c8;
          lVar5 = lVar8 * 2;
          if (local_a8[2] == ref_edge->e2n[lVar8 * 2]) {
            local_8c = *(undefined4 *)((long)__ptr + lVar8 * 8);
            lVar5 = (long)(int)((uint)lVar5 | 1);
          }
          else {
            local_8c = *(undefined4 *)((long)__ptr + (long)(int)((uint)lVar5 | 1) * 4);
          }
          local_88 = *(undefined4 *)((long)__ptr + lVar5 * 4);
          uVar3 = ref_cell_add(ref_grid->cell[5],local_a8,&new_cell);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar9 = "add";
            uVar7 = 0x1059;
            goto LAB_0014d5c5;
          }
        }
      }
      free(__ptr);
      uVar3 = ref_edge_free(ref_edge);
      if (uVar3 == 0) {
        for (iVar10 = 0; pRVar2 = ref_grid->cell[0], iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
          if (pRVar2->c2n[(long)iVar10 * (long)pRVar2->size_per] != -1) {
            ref_cell_remove(pRVar2,iVar10);
          }
        }
        for (iVar10 = 0; pRVar2 = ref_grid->cell[3], iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
          if (pRVar2->c2n[(long)iVar10 * (long)pRVar2->size_per] != -1) {
            ref_cell_remove(pRVar2,iVar10);
          }
        }
        return 0;
      }
      uVar6 = (ulong)uVar3;
      pcVar9 = "free edge";
      uVar7 = 0x105d;
    }
    else {
      uVar6 = (ulong)uVar3;
      pcVar9 = "edge";
      uVar7 = 0x1006;
    }
  }
  else {
    uVar6 = (ulong)uVar3;
    pcVar9 = "constrain";
    uVar7 = 0x1004;
  }
LAB_0014d5c5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
         "ref_geom_enrich3",uVar6,pcVar9);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich3(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_DBL t;

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, 2 * ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      t = 1.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[0 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
      t = 2.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[1 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
    }
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[2] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[3] = edge_node[1 + 2 * edge];
    } else {
      nodes[2] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[3] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "add node");
    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "new node");
    RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
        "new node");
    nodes[9] = node;

    nodes[ref_cell_id_index(ref_grid_tr3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[3] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[4] = edge_node[1 + 2 * edge];
    } else {
      nodes[3] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[4] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    if (nodes[1] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[5] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[6] = edge_node[1 + 2 * edge];
    } else {
      nodes[5] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[6] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    if (nodes[2] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[7] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[8] = edge_node[1 + 2 * edge];
    } else {
      nodes[7] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[8] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_tr3(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }

  return REF_SUCCESS;
}